

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ColumnReader::ReadInternal
          (ColumnReader *this,uint64_t num_values,data_ptr_t define_out,data_ptr_t repeat_out,
          Vector *result)

{
  idx_t read_now;
  uint64_t max_read;
  idx_t result_offset;
  
  result_offset = 0;
  for (max_read = num_values; max_read != 0; max_read = max_read - read_now) {
    read_now = ReadPageHeaders(this,max_read,(optional_ptr<const_duckdb::TableFilter,_true>)0x0,
                               (optional_ptr<duckdb::TableFilterState,_true>)0x0);
    ReadData(this,read_now,define_out,repeat_out,result,result_offset);
    result_offset = result_offset + read_now;
  }
  FinishRead(this,num_values);
  return num_values;
}

Assistant:

idx_t ColumnReader::ReadInternal(uint64_t num_values, data_ptr_t define_out, data_ptr_t repeat_out, Vector &result) {
	idx_t result_offset = 0;
	auto to_read = num_values;
	D_ASSERT(to_read <= STANDARD_VECTOR_SIZE);

	while (to_read > 0) {
		auto read_now = ReadPageHeaders(to_read);

		ReadData(read_now, define_out, repeat_out, result, result_offset);

		result_offset += read_now;
		to_read -= read_now;
	}
	FinishRead(num_values);

	return num_values;
}